

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O2

void __thiscall slang::TimeTrace::Profiler::end(Profiler *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_FS_OFFSET;
  
  stack::__tls_init();
  lVar1 = *in_FS_OFFSET;
  lVar2 = in_FS_OFFSET[-6];
  lVar3 = std::chrono::_V2::steady_clock::now();
  lVar3 = lVar3 - *(long *)(lVar2 + -0x58);
  *(long *)(lVar2 + -0x50) = lVar3;
  if (0x7a507 < lVar3) {
    std::mutex::lock(&this->mut);
    std::vector<slang::Entry,_std::allocator<slang::Entry>_>::emplace_back<slang::Entry>
              (&this->entries,(Entry *)(lVar2 + -0x58));
    pthread_mutex_unlock((pthread_mutex_t *)&this->mut);
  }
  stack::__tls_init();
  std::vector<slang::Entry,_std::allocator<slang::Entry>_>::pop_back
            ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)(lVar1 + -0x38));
  return;
}

Assistant:

void end() {
        SLANG_ASSERT(!stack.empty());
        SLANG_ASSERT(stack.back().threadId == std::this_thread::get_id());

        auto&& entry = stack.back();
        entry.duration = steady_clock::now() - entry.start;

        // Only include sections longer than 500us.
        if (duration_cast<microseconds>(entry.duration).count() > 500) {
            std::scoped_lock<std::mutex> lock(mut);
            entries.emplace_back(std::move(entry));
        }

        stack.pop_back();
    }